

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

vm_obj_id_t CVmObjByteArray::create_from_string(vm_val_t *strval,char *str,vm_val_t *mapval)

{
  uint uVar1;
  wchar_t wVar2;
  int *in_RDX;
  long in_RSI;
  char buf_1 [128];
  size_t out_idx;
  size_t byte_len;
  size_t src_bytes_used;
  CCharmapToLocal *mapper;
  vm_obj_id_t mapid;
  wchar_t ch;
  size_t cur;
  uchar buf [256];
  int idx;
  size_t clen;
  utf8_ptr p;
  size_t len;
  CVmObjByteArray *arr;
  vm_obj_id_t id;
  char *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  vm_val_t *in_stack_fffffffffffffe08;
  CVmObjByteArray *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  CCharmapToLocal *in_stack_fffffffffffffe30;
  long local_168;
  ulong local_150;
  undefined1 local_148 [260];
  int local_44;
  size_t local_40;
  size_t local_30;
  CVmObject *local_28;
  vm_obj_id_t local_1c;
  int *local_18;
  long local_10;
  
  local_1c = 0;
  local_28 = (CVmObject *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = vmb_get_len((char *)0x2c4e83);
  local_10 = local_10 + 2;
  if ((local_18 == (int *)0x0) || (*local_18 == 1)) {
    utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdf8);
    local_40 = utf8_ptr::len((utf8_ptr *)
                             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                             (size_t)in_stack_fffffffffffffdf8);
    local_1c = create(in_stack_fffffffffffffe04,(unsigned_long)in_stack_fffffffffffffdf8);
    local_28 = vm_objp(0);
    local_44 = 1;
    while (local_30 != 0) {
      local_150 = 0;
      while( true ) {
        uVar1 = in_stack_fffffffffffffe04 & 0xffffff;
        if (local_30 != 0) {
          uVar1 = CONCAT13(local_150 < 0x100,(int3)in_stack_fffffffffffffe04);
        }
        in_stack_fffffffffffffe04 = uVar1;
        if ((char)(in_stack_fffffffffffffe04 >> 0x18) == '\0') break;
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x2c4f78);
        if (L'ÿ' < wVar2) {
          err_throw(0);
        }
        local_148[local_150] = (char)wVar2;
        utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffe10,(size_t *)in_stack_fffffffffffffe08);
        local_150 = local_150 + 1;
      }
      cons_copy_from_buf(in_stack_fffffffffffffe10,(uchar *)in_stack_fffffffffffffe08,
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (size_t)in_stack_fffffffffffffdf8);
      local_44 = local_44 + (int)local_150;
    }
  }
  else {
    CVmBif::get_charset_obj(in_stack_fffffffffffffe08);
    vm_objp(0);
    CVmObjCharSet::get_to_local
              ((CVmObjCharSet *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    CCharmapToLocal::map_utf8
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10,
               (size_t *)in_stack_fffffffffffffe08);
    local_1c = create(in_stack_fffffffffffffe04,(unsigned_long)in_stack_fffffffffffffdf8);
    local_28 = vm_objp(0);
    for (; local_30 != 0; local_30 = local_30 - local_168) {
      CCharmapToLocal::map_utf8
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10,
                 (size_t *)in_stack_fffffffffffffe08);
      cons_copy_from_buf(in_stack_fffffffffffffe10,(uchar *)in_stack_fffffffffffffe08,
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (size_t)in_stack_fffffffffffffdf8);
      local_10 = local_168 + local_10;
    }
  }
  return local_1c;
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_string(
    VMG_ const vm_val_t *strval, const char *str, const vm_val_t *mapval)
{
    /* we can't allocate our object until we know the mapped byte count */
    vm_obj_id_t id = VM_INVALID_OBJ;
    CVmObjByteArray *arr = 0;
    
    /* get the string's length and skip the length prefix */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /*
     *   We have two modes: map to bytes via a character set, or stuff
     *   unmapped character values into bytes.  Check which mode we're using.
     */
    if (mapval == 0 || mapval->typ == VM_NIL)
    {
        /* 
         *   No character mapper - just stuff each character into a byte.  If
         *   a character is outside the 0..255 range, it's an error.  
         */

        /* count the number of characters */
        utf8_ptr p((char *)str);
        size_t clen = p.len(len);

        /* allocate the array - each string character is one array byte */
        id = create(vmg_ FALSE, clen);
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);

        /* copy bytes into the array */
        for (int idx = 1 ; len != 0 ; )
        {
            /* translate a buffer-full */
            unsigned char buf[256];
            size_t cur = 0;
            for ( ; len != 0 && cur < sizeof(buf) ; p.inc(&len))
            {
                /* get the next character; make sure it fits in a byte */
                wchar_t ch = p.getch();
                if (ch > 255)
                    err_throw(VMERR_NUM_OVERFLOW);
                
                /* save it */
                buf[cur++] = (unsigned char)ch;
            }
            
            /* copy this chunk to the array */
            arr->cons_copy_from_buf(buf, idx, cur);
            idx += cur;
        }
    }
    else
    {
        /* interpret the character set argument */
        vm_obj_id_t mapid = CVmBif::get_charset_obj(vmg_ mapval);

        /* get the to-local mapping from the character set */
        CCharmapToLocal *mapper =
            ((CVmObjCharSet *)vm_objp(vmg_ mapid))->get_to_local(vmg0_);

        /* 
         *   first, do a mapping with a null output buffer to determine how
         *   many bytes we need for the mapping 
         */
        size_t src_bytes_used;
        size_t byte_len = mapper->map_utf8(0, 0, str, len, &src_bytes_used);
        
        /* allocate a new ByteArray with the required number of bytes */
        id = CVmObjByteArray::create(vmg_ FALSE, byte_len);
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);
        
        /* convert it again, this time storing the bytes */
        for (size_t out_idx = 1 ; len != 0 ; )
        {
            char buf[128];
            
            /* convert a buffer-full */
            byte_len = mapper->map_utf8(buf, sizeof(buf), str, len,
                                        &src_bytes_used);
            
            /* store the bytes in the byte array */
            arr->cons_copy_from_buf((unsigned char *)buf, out_idx, byte_len);
            
            /* advance past the output bytes we used */
            out_idx += byte_len;
            
            /* advance past the source bytes we used */
            str += src_bytes_used;
            len -= src_bytes_used;
        }
    }

    /* return the new array's object ID */
    return id;
}